

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaHeat2D_bnd.c
# Opt level: O0

int main(void)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  UserData data_00;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 *__ptr;
  SUNContext ctx;
  SUNLinearSolver LS;
  SUNMatrix A;
  sunrealtype tret;
  sunrealtype tout;
  sunrealtype t1;
  sunrealtype t0;
  sunrealtype atol;
  sunrealtype rtol;
  sunindextype ml;
  sunindextype mu;
  long ncfn;
  long netf;
  int iout;
  int retval;
  N_Vector res;
  N_Vector id;
  N_Vector constraints;
  N_Vector up;
  N_Vector uu;
  UserData data;
  void *mem;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  void *pvVar8;
  undefined1 local_98 [8];
  double local_90;
  double local_88;
  undefined8 local_80;
  undefined8 local_78;
  N_Vector uu_00;
  sunrealtype t;
  N_Vector in_stack_ffffffffffffffa0;
  void *mem_00;
  N_Vector in_stack_ffffffffffffffa8;
  N_Vector in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined8 local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = 0;
  pvVar8 = (void *)0x0;
  uVar1 = SUNContext_Create(0,&stack0xffffffffffffff50);
  iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  if (iVar2 == 0) {
    uVar4 = N_VNew_Serial(100,in_stack_ffffffffffffff50);
    iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    if (iVar2 == 0) {
      uVar5 = N_VClone(uVar4);
      iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      if (iVar2 == 0) {
        data_00 = (UserData)N_VClone(uVar4);
        iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        if (iVar2 == 0) {
          uVar6 = N_VClone(uVar4);
          iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
          if (iVar2 == 0) {
            uVar7 = N_VClone(uVar4);
            iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
            if (iVar2 == 0) {
              __ptr = (undefined8 *)malloc(0x18);
              iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
              if (iVar2 == 0) {
                *__ptr = 10;
                __ptr[1] = 0x3fbc71c71c71c71c;
                __ptr[2] = 1.0 / ((double)__ptr[1] * (double)__ptr[1]);
                SetInitialProfile(data_00,(N_Vector)CONCAT44(uVar1,in_stack_ffffffffffffffb8),
                                  in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                                  in_stack_ffffffffffffffa0);
                N_VConst(0x3ff0000000000000,uVar6);
                local_80 = 0;
                local_88 = 0.01;
                uu_00 = (N_Vector)0x0;
                local_78 = 0x3f50624dd2f1a9fc;
                local_10 = IDACreate(in_stack_ffffffffffffff50);
                iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
                if (iVar2 == 0) {
                  IDASetUserData(local_10,__ptr);
                  iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
                  if (iVar2 == 0) {
                    IDASetId(local_10,uVar7);
                    iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c)
                    ;
                    if (iVar2 == 0) {
                      IDASetConstraints(local_10,uVar6);
                      iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,
                                           in_stack_ffffffffffffff4c);
                      if (iVar2 == 0) {
                        N_VDestroy(uVar6);
                        IDAInit(local_80,local_10,heatres,uVar4,uVar5);
                        iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,
                                             in_stack_ffffffffffffff4c);
                        if (iVar2 == 0) {
                          IDASStolerances(uu_00,local_78,local_10);
                          iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,
                                               in_stack_ffffffffffffff4c);
                          if (iVar2 == 0) {
                            mem_00 = (void *)0xa;
                            t = 4.94065645841247e-323;
                            uVar6 = SUNBandMatrix(100,10,10,in_stack_ffffffffffffff50);
                            iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,
                                                 in_stack_ffffffffffffff4c);
                            if (iVar2 == 0) {
                              pvVar8 = (void *)SUNLinSol_Band(uVar4,uVar6,in_stack_ffffffffffffff50)
                              ;
                              iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,
                                                   in_stack_ffffffffffffff4c);
                              if (iVar2 == 0) {
                                IDASetLinearSolver(local_10,pvVar8,uVar6);
                                iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,
                                                     in_stack_ffffffffffffff4c);
                                if (iVar2 == 0) {
                                  IDACalcIC(local_88,local_10,1);
                                  iVar2 = check_retval(pvVar8,in_stack_ffffffffffffff50,
                                                       in_stack_ffffffffffffff4c);
                                  if (iVar2 == 0) {
                                    PrintHeader((sunrealtype)in_stack_ffffffffffffff50,
                                                (sunrealtype)
                                                CONCAT44(in_stack_ffffffffffffff4c,
                                                         in_stack_ffffffffffffff48));
                                    PrintOutput(mem_00,t,uu_00);
                                    local_90 = local_88;
                                    for (iVar2 = 1; iVar2 < 0xc; iVar2 = iVar2 + 1) {
                                      IDASolve(local_90,local_10,local_98,uVar4,uVar5,1);
                                      iVar3 = check_retval(pvVar8,in_stack_ffffffffffffff50,
                                                           in_stack_ffffffffffffff4c);
                                      if (iVar3 != 0) {
                                        return 1;
                                      }
                                      PrintOutput(mem_00,t,uu_00);
                                      local_90 = local_90 * 2.0;
                                    }
                                    IDAGetNumErrTestFails(local_10,&stack0xffffffffffffffb0);
                                    check_retval(pvVar8,in_stack_ffffffffffffff50,
                                                 in_stack_ffffffffffffff4c);
                                    IDAGetNumNonlinSolvConvFails(local_10,&stack0xffffffffffffffa8);
                                    check_retval(pvVar8,in_stack_ffffffffffffff50,
                                                 in_stack_ffffffffffffff4c);
                                    printf("\n netf = %ld,   ncfn = %ld \n",
                                           in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
                                    IDAFree(&local_10);
                                    SUNLinSolFree(pvVar8);
                                    SUNMatDestroy(uVar6);
                                    N_VDestroy(uVar4);
                                    N_VDestroy(uVar5);
                                    N_VDestroy(uVar7);
                                    N_VDestroy(data_00);
                                    free(__ptr);
                                    SUNContext_Free(&stack0xffffffffffffff50);
                                    local_4 = 0;
                                  }
                                  else {
                                    local_4 = 1;
                                  }
                                }
                                else {
                                  local_4 = 1;
                                }
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  void* mem;
  UserData data;
  N_Vector uu, up, constraints, id, res;
  int retval, iout;
  long int netf, ncfn;
  sunindextype mu, ml;
  sunrealtype rtol, atol, t0, t1, tout, tret;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  mem  = NULL;
  data = NULL;
  uu = up = constraints = id = res = NULL;
  A                                = NULL;
  LS                               = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Create vectors uu, up, res, constraints, id. */
  uu = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)uu, "N_VNew_Serial", 0)) { return (1); }
  up = N_VClone(uu);
  if (check_retval((void*)up, "N_VNew_Serial", 0)) { return (1); }
  res = N_VClone(uu);
  if (check_retval((void*)res, "N_VNew_Serial", 0)) { return (1); }
  constraints = N_VClone(uu);
  if (check_retval((void*)constraints, "N_VNew_Serial", 0)) { return (1); }
  id = N_VClone(uu);
  if (check_retval((void*)id, "N_VNew_Serial", 0)) { return (1); }

  /* Create and load problem data block. */
  data = (UserData)malloc(sizeof *data);
  if (check_retval((void*)data, "malloc", 2)) { return (1); }
  data->mm    = MGRID;
  data->dx    = ONE / (MGRID - ONE);
  data->coeff = ONE / ((data->dx) * (data->dx));

  /* Initialize uu, up, id. */
  SetInitialProfile(data, uu, up, id, res);

  /* Set constraints to all 1's for nonnegative solution values. */
  N_VConst(ONE, constraints);

  /* Set remaining input parameters. */
  t0   = ZERO;
  t1   = SUN_RCONST(0.01);
  rtol = ZERO;
  atol = SUN_RCONST(1.0e-3);

  /* Call IDACreate and IDAMalloc to initialize solution */
  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDASetUserData(mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  /* Set which components are algebraic or differential */
  retval = IDASetId(mem, id);
  if (check_retval(&retval, "IDASetId", 1)) { return (1); }

  retval = IDASetConstraints(mem, constraints);
  if (check_retval(&retval, "IDASetConstraints", 1)) { return (1); }
  N_VDestroy(constraints);

  retval = IDAInit(mem, heatres, t0, uu, up);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDASStolerances(mem, rtol, atol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Create banded SUNMatrix for use in linear solves */
  mu = MGRID;
  ml = MGRID;
  A  = SUNBandMatrix(NEQ, mu, ml, ctx);
  if (check_retval((void*)A, "SUNBandMatrix", 0)) { return (1); }

  /* Create banded SUNLinearSolver object */
  LS = SUNLinSol_Band(uu, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Call IDACalcIC to correct the initial values. */

  retval = IDACalcIC(mem, IDA_YA_YDP_INIT, t1);
  if (check_retval(&retval, "IDACalcIC", 1)) { return (1); }

  /* Print output heading. */
  PrintHeader(rtol, atol);

  PrintOutput(mem, t0, uu);

  /* Loop over output times, call IDASolve, and print results. */

  for (tout = t1, iout = 1; iout <= NOUT; iout++, tout *= TWO)
  {
    retval = IDASolve(mem, tout, &tret, uu, up, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (1); }

    PrintOutput(mem, tret, uu);
  }

  /* Print remaining counters and free memory. */
  retval = IDAGetNumErrTestFails(mem, &netf);
  check_retval(&retval, "IDAGetNumErrTestFails", 1);
  retval = IDAGetNumNonlinSolvConvFails(mem, &ncfn);
  check_retval(&retval, "IDAGetNumNonlinSolvConvFails", 1);
  printf("\n netf = %ld,   ncfn = %ld \n", netf, ncfn);

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(uu);
  N_VDestroy(up);
  N_VDestroy(id);
  N_VDestroy(res);
  free(data);
  SUNContext_Free(&ctx);

  return (0);
}